

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3SegReaderNextDocid
              (Fts3Table *pTab,Fts3SegReader *pReader,char **ppOffsetList,int *pnOffsetList)

{
  byte *pbVar1;
  int iVar2;
  bool bVar3;
  long local_58;
  sqlite3_int64 iDelta;
  char *pEnd;
  u8 bEof;
  byte *pbStack_40;
  char c;
  char *p;
  int *piStack_30;
  int rc;
  int *pnOffsetList_local;
  char **ppOffsetList_local;
  Fts3SegReader *pReader_local;
  Fts3Table *pTab_local;
  
  p._4_4_ = 0;
  pbStack_40 = (byte *)pReader->pOffsetList;
  pEnd._7_1_ = 0;
  piStack_30 = pnOffsetList;
  pnOffsetList_local = (int *)ppOffsetList;
  ppOffsetList_local = (char **)pReader;
  pReader_local = (Fts3SegReader *)pTab;
  if ((pTab->bDescIdx == '\0') || (pReader->ppNextElem == (Fts3HashElem **)0x0)) {
    iDelta = (sqlite3_int64)(pReader->aDoclist + pReader->nDoclist);
    while( true ) {
      p._4_4_ = 0;
      for (; *pbStack_40 != 0 || pEnd._7_1_ != 0; pbStack_40 = pbStack_40 + 1) {
        pEnd._7_1_ = *pbStack_40 & 0x80;
      }
      if ((ppOffsetList_local[7] == (char *)0x0) ||
         (pbStack_40 < ppOffsetList_local[5] + *(int *)((long)ppOffsetList_local + 0x34))) break;
      iVar2 = fts3SegReaderIncrRead((Fts3SegReader *)ppOffsetList_local);
      if (iVar2 != 0) {
        return iVar2;
      }
    }
    pbStack_40 = pbStack_40 + 1;
    if (pnOffsetList_local != (int *)0x0) {
      *(char **)pnOffsetList_local = ppOffsetList_local[0xe];
      *piStack_30 = ((int)pbStack_40 - (int)ppOffsetList_local[0xe]) + -1;
    }
    while( true ) {
      bVar3 = false;
      if (pbStack_40 < (ulong)iDelta) {
        bVar3 = *pbStack_40 == 0;
      }
      if (!bVar3) break;
      pbStack_40 = pbStack_40 + 1;
    }
    if (pbStack_40 < (ulong)iDelta) {
      p._4_4_ = fts3SegReaderRequire((Fts3SegReader *)ppOffsetList_local,(char *)pbStack_40,10);
      pbVar1 = pbStack_40;
      if (p._4_4_ == 0) {
        iVar2 = sqlite3Fts3GetVarint((char *)pbStack_40,&local_58);
        ppOffsetList_local[0xe] = (char *)(pbVar1 + iVar2);
        if (*(char *)((long)&pReader_local[3].aNode + 7) == '\0') {
          ppOffsetList_local[0x10] = ppOffsetList_local[0x10] + local_58;
        }
        else {
          ppOffsetList_local[0x10] = ppOffsetList_local[0x10] + -local_58;
        }
      }
    }
    else {
      ppOffsetList_local[0xe] = (char *)0x0;
    }
  }
  else {
    pEnd._6_1_ = '\0';
    if (ppOffsetList != (char **)0x0) {
      *ppOffsetList = pReader->pOffsetList;
      *pnOffsetList = pReader->nOffsetList + -1;
    }
    sqlite3Fts3DoclistPrev
              (0,pReader->aDoclist,pReader->nDoclist,(char **)&stack0xffffffffffffffc0,
               &pReader->iDocid,&pReader->nOffsetList,(u8 *)((long)&pEnd + 6));
    if (pEnd._6_1_ == '\0') {
      ppOffsetList_local[0xe] = (char *)pbStack_40;
    }
    else {
      ppOffsetList_local[0xe] = (char *)0x0;
    }
  }
  return 0;
}

Assistant:

static int fts3SegReaderNextDocid(
  Fts3Table *pTab,
  Fts3SegReader *pReader,         /* Reader to advance to next docid */
  char **ppOffsetList,            /* OUT: Pointer to current position-list */
  int *pnOffsetList               /* OUT: Length of *ppOffsetList in bytes */
){
  int rc = SQLITE_OK;
  char *p = pReader->pOffsetList;
  char c = 0;

  assert( p );

  if( pTab->bDescIdx && fts3SegReaderIsPending(pReader) ){
    /* A pending-terms seg-reader for an FTS4 table that uses order=desc.
    ** Pending-terms doclists are always built up in ascending order, so
    ** we have to iterate through them backwards here. */
    u8 bEof = 0;
    if( ppOffsetList ){
      *ppOffsetList = pReader->pOffsetList;
      *pnOffsetList = pReader->nOffsetList - 1;
    }
    sqlite3Fts3DoclistPrev(0,
        pReader->aDoclist, pReader->nDoclist, &p, &pReader->iDocid,
        &pReader->nOffsetList, &bEof
    );
    if( bEof ){
      pReader->pOffsetList = 0;
    }else{
      pReader->pOffsetList = p;
    }
  }else{
    char *pEnd = &pReader->aDoclist[pReader->nDoclist];

    /* Pointer p currently points at the first byte of an offset list. The
    ** following block advances it to point one byte past the end of
    ** the same offset list. */
    while( 1 ){
  
      /* The following line of code (and the "p++" below the while() loop) is
      ** normally all that is required to move pointer p to the desired 
      ** position. The exception is if this node is being loaded from disk
      ** incrementally and pointer "p" now points to the first byte past
      ** the populated part of pReader->aNode[].
      */
      while( *p | c ) c = *p++ & 0x80;
      assert( *p==0 );
  
      if( pReader->pBlob==0 || p<&pReader->aNode[pReader->nPopulate] ) break;
      rc = fts3SegReaderIncrRead(pReader);
      if( rc!=SQLITE_OK ) return rc;
    }
    p++;
  
    /* If required, populate the output variables with a pointer to and the
    ** size of the previous offset-list.
    */
    if( ppOffsetList ){
      *ppOffsetList = pReader->pOffsetList;
      *pnOffsetList = (int)(p - pReader->pOffsetList - 1);
    }

    /* List may have been edited in place by fts3EvalNearTrim() */
    while( p<pEnd && *p==0 ) p++;
  
    /* If there are no more entries in the doclist, set pOffsetList to
    ** NULL. Otherwise, set Fts3SegReader.iDocid to the next docid and
    ** Fts3SegReader.pOffsetList to point to the next offset list before
    ** returning.
    */
    if( p>=pEnd ){
      pReader->pOffsetList = 0;
    }else{
      rc = fts3SegReaderRequire(pReader, p, FTS3_VARINT_MAX);
      if( rc==SQLITE_OK ){
        sqlite3_int64 iDelta;
        pReader->pOffsetList = p + sqlite3Fts3GetVarint(p, &iDelta);
        if( pTab->bDescIdx ){
          pReader->iDocid -= iDelta;
        }else{
          pReader->iDocid += iDelta;
        }
      }
    }
  }

  return SQLITE_OK;
}